

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O2

bool __thiscall indk::Event::doWait(Event *this)

{
  bool bVar1;
  unique_lock<std::mutex> oNotifierLock;
  unique_lock<std::mutex> uStack_28;
  
  std::unique_lock<std::mutex>::unique_lock(&uStack_28,&this->m_oMutex);
  std::condition_variable::wait((unique_lock *)&this->m_oConditionVariable);
  bVar1 = this->m_bEvent;
  this->m_bEvent = false;
  std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  return bVar1;
}

Assistant:

bool indk::Event::doWait() {
    bool bRet;
    std::unique_lock<std::mutex> oNotifierLock(m_oMutex);
    m_oConditionVariable.wait(oNotifierLock);
    bRet = m_bEvent;
    m_bEvent = false;
    return bRet;
}